

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  bool bVar1;
  byte bVar2;
  OfType OVar3;
  size_t sVar4;
  ReusableStringStream *pRVar5;
  Column *value;
  string local_218;
  SourceLineInfo local_1f8;
  char local_1e1;
  reference local_1e0;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  string local_1b8;
  string local_198;
  char local_172 [2];
  string local_170;
  Column local_150;
  char local_119;
  string local_118;
  undefined1 local_f8 [8];
  ReusableStringStream rss;
  allocator local_c9;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  ScopedElement e;
  string local_40 [8];
  string elementName;
  AssertionResult *result;
  AssertionStats *stats_local;
  JunitReporter *this_local;
  
  elementName.field_2._8_8_ = &stats->assertionResult;
  bVar1 = AssertionResult::isOk((AssertionResult *)elementName.field_2._8_8_);
  if (bVar1) {
    return;
  }
  std::__cxx11::string::string(local_40);
  OVar3 = AssertionResult::getResultType((AssertionResult *)elementName.field_2._8_8_);
  if ((3 < (uint)(OVar3 + Info)) && (OVar3 != FailureBit)) {
    if ((uint)(OVar3 + ~FailureBit) < 2) {
LAB_0013d876:
      std::__cxx11::string::operator=(local_40,"failure");
      goto LAB_0013d89e;
    }
    if (OVar3 != Exception) {
      if (OVar3 != ThrewException) {
        if (OVar3 == DidntThrowException) goto LAB_0013d876;
        if (OVar3 != FatalErrorCondition) goto LAB_0013d89e;
      }
      std::__cxx11::string::operator=(local_40,"error");
      goto LAB_0013d89e;
    }
  }
  std::__cxx11::string::operator=(local_40,"internalError");
LAB_0013d89e:
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_60,(string *)&this->xml,(XmlFormatting)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"message",&local_81);
  AssertionResult::getExpression_abi_cxx11_(&local_a8,(AssertionResult *)elementName.field_2._8_8_);
  XmlWriter::writeAttribute(&this->xml,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"type",&local_c9);
  join_0x00000010_0x00000000_ =
       AssertionResult::getTestMacroName((AssertionResult *)elementName.field_2._8_8_);
  XmlWriter::writeAttribute<Catch::StringRef>(&this->xml,&local_c8,(StringRef *)&rss.m_oss);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_f8);
  sVar4 = Counts::total(&(stats->totals).assertions);
  if (sVar4 == 0) {
    local_172[0] = '\n';
    ReusableStringStream::operator<<((ReusableStringStream *)local_f8,local_172);
  }
  else {
    pRVar5 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)local_f8,(char (*) [7])"FAILED");
    ReusableStringStream::operator<<(pRVar5,(char (*) [3])0x1f7d81);
    bVar1 = AssertionResult::hasExpression((AssertionResult *)elementName.field_2._8_8_);
    if (bVar1) {
      ReusableStringStream::operator<<((ReusableStringStream *)local_f8,(char (*) [3])"  ");
      AssertionResult::getExpressionInMacro_abi_cxx11_
                (&local_118,(AssertionResult *)elementName.field_2._8_8_);
      ReusableStringStream::operator<<((ReusableStringStream *)local_f8,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      local_119 = '\n';
      ReusableStringStream::operator<<((ReusableStringStream *)local_f8,&local_119);
    }
    bVar1 = AssertionResult::hasExpandedExpression((AssertionResult *)elementName.field_2._8_8_);
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)local_f8,(char (*) [17])"with expansion:\n");
      AssertionResult::getExpandedExpression_abi_cxx11_
                (&local_170,(AssertionResult *)elementName.field_2._8_8_);
      clara::TextFlow::Column::Column(&local_150,&local_170);
      value = clara::TextFlow::Column::indent(&local_150,2);
      pRVar5 = ReusableStringStream::operator<<((ReusableStringStream *)local_f8,value);
      local_172[1] = 10;
      ReusableStringStream::operator<<(pRVar5,local_172 + 1);
      clara::TextFlow::Column::~Column(&local_150);
      std::__cxx11::string::~string((string *)&local_170);
    }
  }
  AssertionResult::getMessage_abi_cxx11_(&local_198,(AssertionResult *)elementName.field_2._8_8_);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_198);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    AssertionResult::getMessage_abi_cxx11_(&local_1b8,(AssertionResult *)elementName.field_2._8_8_);
    pRVar5 = ReusableStringStream::operator<<((ReusableStringStream *)local_f8,&local_1b8);
    __range2._7_1_ = 10;
    ReusableStringStream::operator<<(pRVar5,(char *)((long)&__range2 + 7));
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  __end2 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                     (&stats->infoMessages);
  msg = (MessageInfo *)
        clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                  (&stats->infoMessages);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                     *)&msg), bVar1) {
    local_1e0 = __gnu_cxx::
                __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                ::operator*(&__end2);
    if (local_1e0->type == Info) {
      pRVar5 = ReusableStringStream::operator<<
                         ((ReusableStringStream *)local_f8,&local_1e0->message);
      local_1e1 = '\n';
      ReusableStringStream::operator<<(pRVar5,&local_1e1);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&__end2);
  }
  pRVar5 = ReusableStringStream::operator<<((ReusableStringStream *)local_f8,(char (*) [4])0x1f7a55)
  ;
  local_1f8 = AssertionResult::getSourceInfo((AssertionResult *)elementName.field_2._8_8_);
  ReusableStringStream::operator<<(pRVar5,&local_1f8);
  ReusableStringStream::str_abi_cxx11_(&local_218,(ReusableStringStream *)local_f8);
  XmlWriter::writeText(&this->xml,&local_218,Newline);
  std::__cxx11::string::~string((string *)&local_218);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_f8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if( !result.isOk() ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;

                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message", result.getExpression() );
            xml.writeAttribute( "type", result.getTestMacroName() );

            ReusableStringStream rss;
            if (stats.totals.assertions.total() > 0) {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            } else {
                rss << '\n';
            }

            if( !result.getMessage().empty() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }